

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t bid_get_line(archive_read_filter *filter,uchar **b,ssize_t *avail,ssize_t *ravail,
                    ssize_t *nl,size_t *nbytes_read)

{
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  size_t *in_RCX;
  size_t *in_RDX;
  long *in_RSI;
  ssize_t *in_R8;
  archive_read_filter *in_R9;
  bool bVar4;
  ssize_t tested;
  size_t nbytes_req;
  ssize_t diff;
  int quit;
  ssize_t len;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  size_t min;
  
  iVar5 = 0;
  if (*in_RDX == 0) {
    *in_R8 = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = get_line((uchar *)*in_RSI,*in_RDX,in_R8);
  }
  while( true ) {
    min = sVar3;
    bVar4 = false;
    if (((*in_R8 == 0) && (bVar4 = false, min == *in_RDX)) && (bVar4 = false, iVar5 == 0)) {
      bVar4 = (ulong)in_R9->position < 0x20000;
    }
    if (!bVar4) break;
    sVar3 = *in_RCX;
    sVar1 = *in_RDX;
    pvVar2 = __archive_read_filter_ahead
                       (in_R9,min,(ssize_t *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    *in_RSI = (long)pvVar2;
    if (*in_RSI == 0) {
      if ((long)*in_RDX <= (long)*in_RCX) {
        return 0;
      }
      pvVar2 = __archive_read_filter_ahead
                         (in_R9,min,(ssize_t *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
      *in_RSI = (long)pvVar2;
      iVar5 = 1;
    }
    in_R9->position = *in_RDX;
    *in_RCX = *in_RDX;
    *in_RSI = (sVar3 - sVar1) + *in_RSI;
    *in_RDX = *in_RDX - (sVar3 - sVar1);
    sVar3 = get_line((uchar *)(*in_RSI + min),*in_RDX - min,in_R8);
    if (-1 < (long)sVar3) {
      sVar3 = min + sVar3;
    }
  }
  return min;
}

Assistant:

static ssize_t
bid_get_line(struct archive_read_filter *filter,
    const unsigned char **b, ssize_t *avail, ssize_t *ravail,
    ssize_t *nl, size_t* nbytes_read)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line(*b, *avail, nl);

	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit &&
	    *nbytes_read < UUENCODE_BID_MAX_READ) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_filter_ahead(filter, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of a stream. */
			*b = __archive_read_filter_ahead(filter, *avail, avail);
			quit = 1;
		}
		*nbytes_read = *avail;
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determinated. */
		len = get_line(*b + tested, *avail - tested, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}